

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<float>::default_cost_type
          (default_cost_type<float> *this,default_cost_type<float> *other,int n)

{
  pointer __first;
  pointer __result;
  int n_local;
  default_cost_type<float> *other_local;
  default_cost_type<float> *this_local;
  
  this->obj = other->obj;
  std::make_unique<float[]>((size_t)&this->linear_elements);
  __first = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&other->linear_elements);
  __result = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->linear_elements);
  std::copy_n<float*,int,float*>(__first,n,__result);
  return;
}

Assistant:

default_cost_type(const default_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
    }